

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

Result __thiscall wabt::anon_unknown_7::Validator::OnCallExpr(Validator *this,CallExpr *expr)

{
  bool bVar1;
  Result result;
  Func *local_28;
  Func *callee;
  CallExpr *expr_local;
  Validator *this_local;
  
  this->expr_loc_ = &(expr->super_ExprMixin<(wabt::ExprType)11>).super_Expr.loc;
  callee = (Func *)expr;
  expr_local = (CallExpr *)this;
  result = CheckFuncVar(this,&expr->var,&local_28);
  bVar1 = Succeeded(result);
  if (bVar1) {
    TypeChecker::OnCall(&this->typechecker_,&(local_28->decl).sig.param_types,
                        &(local_28->decl).sig.result_types);
  }
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result Validator::OnCallExpr(CallExpr* expr) {
  expr_loc_ = &expr->loc;
  const Func* callee;
  if (Succeeded(CheckFuncVar(&expr->var, &callee))) {
    typechecker_.OnCall(callee->decl.sig.param_types,
                        callee->decl.sig.result_types);
  }
  return Result::Ok;
}